

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_lsp2lpc(HTS_Vocoder *v,double *lsp,double *a,int m)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  int in_ECX;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined8 *in_RDX;
  double *in_RSI;
  long in_RDI;
  bool bVar9;
  double dVar10;
  double *b2;
  double *b1;
  double *b0;
  double *a2;
  double *a1;
  double *a0;
  double *q;
  double *p;
  double xff;
  double xf;
  double xx;
  int flag_odd;
  int mh2;
  int mh1;
  int k;
  int i;
  size_t in_stack_ffffffffffffff80;
  double *pdVar11;
  size_t in_stack_ffffffffffffff88;
  double *pdVar12;
  double local_48;
  double local_40;
  double local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  
  bVar9 = in_ECX % 2 != 0;
  if (bVar9) {
    local_28 = (in_ECX + 1) / 2;
    local_2c = (in_ECX + -1) / 2;
  }
  else {
    local_2c = in_ECX / 2;
    local_28 = local_2c;
  }
  if (*(ulong *)(in_RDI + 0xe8) < (ulong)(long)in_ECX) {
    if (*(long *)(in_RDI + 0xe0) != 0) {
      HTS_free((void *)0x114296);
    }
    pvVar1 = HTS_calloc(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    *(void **)(in_RDI + 0xe0) = pvVar1;
    *(long *)(in_RDI + 0xe8) = (long)in_ECX;
  }
  lVar2 = *(long *)(in_RDI + 0xe0) + (long)in_ECX * 8;
  lVar3 = lVar2 + (long)local_28 * 8;
  pdVar4 = (double *)(lVar3 + (long)local_2c * 8);
  iVar6 = local_28 + 1;
  lVar8 = (long)(local_28 + 1);
  pdVar12 = pdVar4 + (long)iVar6 + lVar8 + (local_28 + 1);
  pdVar5 = pdVar12 + (local_2c + 1);
  iVar7 = local_2c + 1;
  pdVar11 = pdVar5;
  HTS_movem(in_RSI,*(double **)(in_RDI + 0xe0),in_ECX);
  for (local_20 = 0; local_20 < local_28 + 1; local_20 = local_20 + 1) {
    pdVar4[local_20] = 0.0;
  }
  for (local_20 = 0; local_20 < local_28 + 1; local_20 = local_20 + 1) {
    pdVar4[(long)iVar6 + (long)local_20] = 0.0;
  }
  for (local_20 = 0; local_20 < local_28 + 1; local_20 = local_20 + 1) {
    pdVar4[(long)iVar6 + lVar8 + local_20] = 0.0;
  }
  for (local_20 = 0; local_20 < local_2c + 1; local_20 = local_20 + 1) {
    pdVar12[local_20] = 0.0;
  }
  for (local_20 = 0; local_20 < local_2c + 1; local_20 = local_20 + 1) {
    pdVar11[local_20] = 0.0;
  }
  for (local_20 = 0; local_20 < local_2c + 1; local_20 = local_20 + 1) {
    pdVar5[(long)iVar7 + (long)local_20] = 0.0;
  }
  local_24 = 0;
  for (local_20 = 0; local_20 < local_28; local_20 = local_20 + 1) {
    dVar10 = cos(*(double *)(*(long *)(in_RDI + 0xe0) + (long)local_24 * 8));
    *(double *)(lVar2 + (long)local_20 * 8) = dVar10 * -2.0;
    local_24 = local_24 + 2;
  }
  local_24 = 0;
  for (local_20 = 0; local_20 < local_2c; local_20 = local_20 + 1) {
    dVar10 = cos(*(double *)(*(long *)(in_RDI + 0xe0) + (long)(local_24 + 1) * 8));
    *(double *)(lVar3 + (long)local_20 * 8) = dVar10 * -2.0;
    local_24 = local_24 + 2;
  }
  local_38 = 1.0;
  local_48 = 0.0;
  local_40 = 0.0;
  for (local_24 = 0; local_24 <= in_ECX; local_24 = local_24 + 1) {
    if (bVar9) {
      *pdVar4 = local_38;
      *pdVar12 = local_38 - local_48;
      local_48 = local_40;
    }
    else {
      *pdVar4 = local_38 + local_40;
      *pdVar12 = local_38 - local_40;
    }
    local_40 = local_38;
    for (local_20 = 0; local_20 < local_28; local_20 = local_20 + 1) {
      pdVar4[local_20 + 1] =
           *(double *)(lVar2 + (long)local_20 * 8) * pdVar4[(long)iVar6 + (long)local_20] +
           pdVar4[local_20] + pdVar4[(long)iVar6 + lVar8 + local_20];
      pdVar4[(long)iVar6 + lVar8 + local_20] = pdVar4[(long)iVar6 + (long)local_20];
      pdVar4[(long)iVar6 + (long)local_20] = pdVar4[local_20];
    }
    for (local_20 = 0; local_20 < local_2c; local_20 = local_20 + 1) {
      pdVar12[local_20 + 1] =
           *(double *)(lVar3 + (long)local_20 * 8) * pdVar11[local_20] + pdVar12[local_20] +
           pdVar5[(long)iVar7 + (long)local_20];
      pdVar5[(long)iVar7 + (long)local_20] = pdVar11[local_20];
      pdVar11[local_20] = pdVar12[local_20];
    }
    if (local_24 != 0) {
      in_RDX[local_24 + -1] = (pdVar4[local_28] + pdVar12[local_2c]) * -0.5;
    }
    local_38 = 0.0;
  }
  for (local_20 = in_ECX + -1; -1 < local_20; local_20 = local_20 + -1) {
    in_RDX[local_20 + 1] = in_RDX[local_20] ^ 0x8000000000000000;
  }
  *in_RDX = 0x3ff0000000000000;
  return;
}

Assistant:

static void HTS_lsp2lpc(HTS_Vocoder * v, double *lsp, double *a, const int m)
{
   int i, k, mh1, mh2, flag_odd;
   double xx, xf, xff;
   double *p, *q;
   double *a0, *a1, *a2, *b0, *b1, *b2;

   flag_odd = 0;
   if (m % 2 == 0)
      mh1 = mh2 = m / 2;
   else {
      mh1 = (m + 1) / 2;
      mh2 = (m - 1) / 2;
      flag_odd = 1;
   }

   if (m > v->lsp2lpc_size) {
      if (v->lsp2lpc_buff != NULL)
         HTS_free(v->lsp2lpc_buff);
      v->lsp2lpc_buff = (double *) HTS_calloc(5 * m + 6, sizeof(double));
      v->lsp2lpc_size = m;
   }
   p = v->lsp2lpc_buff + m;
   q = p + mh1;
   a0 = q + mh2;
   a1 = a0 + (mh1 + 1);
   a2 = a1 + (mh1 + 1);
   b0 = a2 + (mh1 + 1);
   b1 = b0 + (mh2 + 1);
   b2 = b1 + (mh2 + 1);

   HTS_movem(lsp, v->lsp2lpc_buff, m);

   for (i = 0; i < mh1 + 1; i++)
      a0[i] = 0.0;
   for (i = 0; i < mh1 + 1; i++)
      a1[i] = 0.0;
   for (i = 0; i < mh1 + 1; i++)
      a2[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b0[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b1[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b2[i] = 0.0;

   /* lsp filter parameters */
   for (i = k = 0; i < mh1; i++, k += 2)
      p[i] = -2.0 * cos(v->lsp2lpc_buff[k]);
   for (i = k = 0; i < mh2; i++, k += 2)
      q[i] = -2.0 * cos(v->lsp2lpc_buff[k + 1]);

   /* impulse response of analysis filter */
   xx = 1.0;
   xf = xff = 0.0;

   for (k = 0; k <= m; k++) {
      if (flag_odd) {
         a0[0] = xx;
         b0[0] = xx - xff;
         xff = xf;
         xf = xx;
      } else {
         a0[0] = xx + xf;
         b0[0] = xx - xf;
         xf = xx;
      }

      for (i = 0; i < mh1; i++) {
         a0[i + 1] = a0[i] + p[i] * a1[i] + a2[i];
         a2[i] = a1[i];
         a1[i] = a0[i];
      }

      for (i = 0; i < mh2; i++) {
         b0[i + 1] = b0[i] + q[i] * b1[i] + b2[i];
         b2[i] = b1[i];
         b1[i] = b0[i];
      }

      if (k != 0)
         a[k - 1] = -0.5 * (a0[mh1] + b0[mh2]);
      xx = 0.0;
   }

   for (i = m - 1; i >= 0; i--)
      a[i + 1] = -a[i];
   a[0] = 1.0;
}